

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

PointerType * LLVMBC::PointerType::get(Type *pointee,uint addr_space)

{
  bool bVar1;
  TypeID TVar2;
  uint uVar3;
  LLVMContext *this;
  Vector<Type_*> *this_00;
  reference ppTVar4;
  Type *pTVar5;
  PointerType *local_68;
  PointerType *local_60;
  PointerType *type;
  PointerType *pointer_type;
  Type *type_1;
  iterator __end1;
  iterator __begin1;
  Vector<Type_*> *__range1;
  Vector<Type_*> *cache;
  LLVMContext *context;
  Type *pTStack_18;
  uint addr_space_local;
  Type *pointee_local;
  
  context._4_4_ = addr_space;
  pTStack_18 = pointee;
  this = Type::getContext(pointee);
  this_00 = LLVMContext::get_type_cache(this);
  __end1 = std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::begin
                     (this_00);
  type_1 = (Type *)std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::end
                             (this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
                                *)&type_1);
    if (!bVar1) {
      local_68 = LLVMContext::construct<LLVMBC::PointerType,LLVMBC::Type*&,unsigned_int&>
                           (this,&stack0xffffffffffffffe8,(uint *)((long)&context + 4));
      local_60 = local_68;
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
                (this_00,(value_type *)&local_68);
      return local_60;
    }
    ppTVar4 = __gnu_cxx::
              __normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
              ::operator*(&__end1);
    pointer_type = (PointerType *)*ppTVar4;
    TVar2 = Type::getTypeID((Type *)pointer_type);
    if (TVar2 == PointerTyID) {
      type = cast<LLVMBC::PointerType>(&pointer_type->super_Type);
      uVar3 = Type::getAddressSpace(&type->super_Type);
      if ((uVar3 == context._4_4_) && (pTVar5 = getElementType(type), pTVar5 == pTStack_18)) {
        return type;
      }
    }
    __gnu_cxx::
    __normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

PointerType *PointerType::get(Type *pointee, unsigned addr_space)
{
	auto &context = pointee->getContext();
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
	{
		if (type->getTypeID() == TypeID::PointerTyID)
		{
			auto *pointer_type = cast<PointerType>(type);
			if (pointer_type->getAddressSpace() == addr_space && pointer_type->getElementType() == pointee)
				return pointer_type;
		}
	}

	auto *type = context.construct<PointerType>(pointee, addr_space);
	cache.push_back(type);
	return type;
}